

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void edition_unittest::TestExtensionOrderings1::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  undefined8 *puVar2;
  Arena *in_RCX;
  char *extraout_RDX;
  char *pcVar3;
  uint unaff_EBP;
  MessageLite *pMVar4;
  MessageLite *this;
  string_view value;
  
  if (from_msg == to_msg) {
    pMVar4 = to_msg;
    this = from_msg;
    MergeImpl();
    pcVar3 = extraout_RDX;
LAB_00c31954:
    in_RCX = *(Arena **)((ulong)in_RCX & 0xfffffffffffffffe);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 1) == 0) goto LAB_00c31914;
    puVar2 = (undefined8 *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    pcVar3 = (char *)*puVar2;
    pMVar4 = (MessageLite *)puVar2[1];
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
    this = (MessageLite *)&to_msg[1]._internal_metadata_;
    in_RCX = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)in_RCX & 1) != 0) goto LAB_00c31954;
  }
  value._M_str = pcVar3;
  value._M_len = (size_t)pMVar4;
  google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)this,value,in_RCX);
LAB_00c31914:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestExtensionOrderings1::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestExtensionOrderings1*>(&to_msg);
  auto& from = static_cast<const TestExtensionOrderings1&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestExtensionOrderings1)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_internal_set_my_string(from._internal_my_string());
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}